

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O1

void Omega_h::context_adding_routine
               (vector<int,_std::allocator<int>_> *lane,int zeta_pointer,Context *contexts_generated
               ,Contexts *contexts,bool verbose,GrammarPtr *grammar)

{
  uint uVar1;
  size_t sVar2;
  pointer piVar3;
  ostream *poVar4;
  long lVar5;
  Contexts *pCVar6;
  char cVar7;
  char *pcVar8;
  undefined3 in_register_00000081;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char local_46;
  char local_45;
  int local_44;
  Contexts *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  iVar9 = CONCAT31(in_register_00000081,verbose);
  uVar10 = (ulong)(uint)zeta_pointer;
  local_40 = contexts;
  local_38 = lane;
  if (iVar9 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  CONTEXT ADDING ROUTINE\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  LANE:",7);
    print_stack(local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  $\\zeta$-POINTER = ",0x14);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,zeta_pointer);
    local_45 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_45,1);
  }
  if (-1 < zeta_pointer) {
    sVar2 = (contexts_generated->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_44 = iVar9;
    while (sVar2 != 0) {
      piVar3 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(int)((ulong)((long)(local_38->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2)
          <= (long)uVar10) {
        fail("assertion %s failed at %s +%d\n","i < int(v.size())",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,0x1e);
      }
      uVar1 = piVar3[uVar10];
      uVar11 = (ulong)uVar1;
      cVar7 = (char)iVar9;
      if (cVar7 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    r = ",8);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", $v_r$ = ",10);
      }
      pCVar6 = local_40;
      if ((int)uVar1 < 0) {
        if (cVar7 != '\0') {
          if (uVar11 == 0xffffff9c) {
            lVar5 = 5;
            pcVar8 = "zero\n";
          }
          else {
            if (uVar1 != 0xfffffe4f) goto LAB_0024169a;
            lVar5 = 7;
            pcVar8 = "marker\n";
          }
LAB_00241695:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar5);
        }
      }
      else {
        if (cVar7 == '\0') {
          subtract_from<int>(contexts_generated,
                             (local_40->
                             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar11);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"$\\tau_r$ = ",0xb);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar1);
          local_46 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_46,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"    CONTEXTS_GENERATED = ",0x19);
          print_set(contexts_generated,
                    (grammar->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ",0x19);
          print_set((local_40->
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar11,
                    (grammar->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - CONTEXTS_$\\tau_r$",0x41);
          pCVar6 = local_40;
          subtract_from<int>(contexts_generated,
                             (local_40->
                             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n    CONTEXTS_GENERATED = ",0x1a);
          print_set(contexts_generated,
                    (grammar->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
          iVar9 = local_44;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U CONTEXTS_GENERATED",0x40);
        }
        unite_with<int>((pCVar6->
                        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar11,contexts_generated);
        if ((char)iVar9 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ",0x19);
          print_set((pCVar6->
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar11,
                    (grammar->super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
          lVar5 = 1;
          pcVar8 = "\n";
          iVar9 = local_44;
          goto LAB_00241695;
        }
      }
LAB_0024169a:
      if ((long)uVar10 < 1) {
        return;
      }
      uVar10 = uVar10 - 1;
      sVar2 = (contexts_generated->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
  }
  return;
}

Assistant:

static void context_adding_routine(std::vector<int> const& lane,
    int zeta_pointer, Context& contexts_generated, Contexts& contexts,
    bool verbose, GrammarPtr grammar) {
  if (verbose) {
    std::cerr << "  CONTEXT ADDING ROUTINE\n";
    std::cerr << "  LANE:";
    print_stack(lane);
    std::cerr << "  $\\zeta$-POINTER = " << zeta_pointer << '\n';
  }
  for (int r = zeta_pointer; r >= 0 && (!contexts_generated.empty()); --r) {
    auto v_r = at(lane, r);
    if (verbose) std::cerr << "    r = " << r << ", $v_r$ = ";
    if (v_r < 0) {
      if (verbose) {
        if (v_r == MARKER)
          std::cerr << "marker\n";
        else if (v_r == ZERO)
          std::cerr << "zero\n";
      }
      continue;
    }
    auto tau_r_addr = v_r;
    if (verbose) {
      std::cerr << "$\\tau_r$ = " << tau_r_addr << '\n';
      std::cerr << "    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - "
                   "CONTEXTS_$\\tau_r$";
    }
    subtract_from(contexts_generated, at(contexts, tau_r_addr));
    if (verbose) {
      std::cerr << "\n    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U "
                   "CONTEXTS_GENERATED";
    }
    unite_with(at(contexts, tau_r_addr), contexts_generated);
    if (verbose) {
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n";
    }
  }
}